

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateColumnNames(Parse *pParse,SrcList *pTabList,ExprList *pEList)

{
  uint uVar1;
  Vdbe *p_00;
  sqlite3 *db_00;
  Expr *pEVar2;
  Table *pTVar3;
  char *pcVar4;
  bool bVar5;
  char *zName_1;
  char *pcStack_60;
  int iCol;
  char *zCol;
  Table *pTab;
  char *zName;
  Expr *p;
  int shortNames;
  int fullNames;
  sqlite3 *db;
  int j;
  int i;
  Vdbe *v;
  ExprList *pEList_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  db_00 = pParse->db;
  if ((((pParse->explain == '\0') && (pParse->colNamesSet == '\0')) && (p_00 != (Vdbe *)0x0)) &&
     (db_00->mallocFailed == '\0')) {
    pParse->colNamesSet = '\x01';
    bVar5 = (db_00->flags & 4U) != 0;
    uVar1 = db_00->flags;
    sqlite3VdbeSetNumCols(p_00,pEList->nExpr);
    for (db._4_4_ = 0; db._4_4_ < pEList->nExpr; db._4_4_ = db._4_4_ + 1) {
      pEVar2 = pEList->a[db._4_4_].pExpr;
      if (pEVar2 != (Expr *)0x0) {
        if (pEList->a[db._4_4_].zName == (char *)0x0) {
          if (((pEVar2->op == 0x98) || (pEVar2->op == 0x9a)) && (pTabList != (SrcList *)0x0)) {
            zName_1._4_4_ = (int)pEVar2->iColumn;
            db._0_4_ = 0;
            while (((int)db < pTabList->nSrc && (pTabList->a[(int)db].iCursor != pEVar2->iTable))) {
              db._0_4_ = (int)db + 1;
            }
            pTVar3 = pTabList->a[(int)db].pTab;
            if (zName_1._4_4_ < 0) {
              zName_1._4_4_ = (int)pTVar3->iPKey;
            }
            if (zName_1._4_4_ < 0) {
              pcStack_60 = "rowid";
            }
            else {
              pcStack_60 = pTVar3->aCol[zName_1._4_4_].zName;
            }
            if (((uVar1 & 8) != 0) || (bVar5)) {
              if (bVar5) {
                pcVar4 = sqlite3MPrintf(db_00,"%s.%s",pTVar3->zName,pcStack_60);
                sqlite3VdbeSetColName(p_00,db._4_4_,0,pcVar4,sqlite3MallocSize);
              }
              else {
                sqlite3VdbeSetColName
                          (p_00,db._4_4_,0,pcStack_60,(_func_void_void_ptr *)0xffffffffffffffff);
              }
            }
            else {
              pcVar4 = sqlite3DbStrDup(db_00,pEList->a[db._4_4_].zSpan);
              sqlite3VdbeSetColName(p_00,db._4_4_,0,pcVar4,sqlite3MallocSize);
            }
          }
          else {
            pcVar4 = sqlite3DbStrDup(db_00,pEList->a[db._4_4_].zSpan);
            sqlite3VdbeSetColName(p_00,db._4_4_,0,pcVar4,sqlite3MallocSize);
          }
        }
        else {
          sqlite3VdbeSetColName
                    (p_00,db._4_4_,0,pEList->a[db._4_4_].zName,
                     (_func_void_void_ptr *)0xffffffffffffffff);
        }
      }
    }
    generateColumnTypes(pParse,pTabList,pEList);
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  SrcList *pTabList,  /* List of tables */
  ExprList *pEList    /* Expressions defining the result set */
){
  Vdbe *v = pParse->pVdbe;
  int i, j;
  sqlite3 *db = pParse->db;
  int fullNames, shortNames;

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet || NEVER(v==0) || db->mallocFailed ) return;
  pParse->colNamesSet = 1;
  fullNames = (db->flags & SQLITE_FullColNames)!=0;
  shortNames = (db->flags & SQLITE_ShortColNames)!=0;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p;
    p = pEList->a[i].pExpr;
    if( NEVER(p==0) ) continue;
    if( pEList->a[i].zName ){
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( (p->op==TK_COLUMN || p->op==TK_AGG_COLUMN) && pTabList ){
      Table *pTab;
      char *zCol;
      int iCol = p->iColumn;
      for(j=0; ALWAYS(j<pTabList->nSrc); j++){
        if( pTabList->a[j].iCursor==p->iTable ) break;
      }
      assert( j<pTabList->nSrc );
      pTab = pTabList->a[j].pTab;
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( !shortNames && !fullNames ){
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
            sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
      }else if( fullNames ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, 
          sqlite3DbStrDup(db, pEList->a[i].zSpan), SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}